

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O0

int match_tables(ip_tables_t *ipts,packet_t *pkt,ip_opt_t *opt)

{
  int iVar1;
  double in_XMM0_Qa;
  int local_34;
  int local_30;
  int j;
  int i;
  int target;
  ip_opt_t *opt_local;
  packet_t *pkt_local;
  ip_tables_t *ipts_local;
  
  if ((ipts == (ip_tables_t *)0x0) || (pkt == (packet_t *)0x0)) {
    _log(in_XMM0_Qa);
    ipts_local._4_4_ = 6;
  }
  else {
    _i = opt;
    if (opt == (ip_opt_t *)0x0) {
      _i = &default_opt;
    }
    for (local_30 = 0; local_30 < 5; local_30 = local_30 + 1) {
      for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
        if ((((_i->list[local_34][local_30] != '\0') &&
             (ipts->tables[local_34] != (ip_table_t *)0x0)) &&
            (ipts->tables[local_34]->chains[local_30] != (ip_chain_t *)0x0)) &&
           (iVar1 = match_chain(ipts->tables[local_34]->chains[local_30],pkt), iVar1 == 0)) {
          return 0;
        }
      }
    }
    ipts_local._4_4_ = 1;
  }
  return ipts_local._4_4_;
}

Assistant:

int match_tables(ip_tables_t *ipts, packet_t *pkt, ip_opt_t *opt)
{
	if (ipts == NULL || pkt == NULL) {
		log_err("%s ipts or pkt is null\n", __FUNCTION__);
		return TARGET_NONE;
	}

	if (opt == NULL) {
		opt = &default_opt;
	}

	int target = TARGET_NONE;

	for (int i = 0; i < CHAIN_MAX; i++) {

		for (int j = 0; j < TABLE_MAX; j++) {

			if (opt->list[j][i] == 0 || ipts->tables[j] == NULL || ipts->tables[j]->chains[i] == NULL) {
				continue;
			}

			target = match_chain(ipts->tables[j]->chains[i], pkt);

			if (target == TARGET_DROP) {
				return TARGET_DROP;
			}
		}
	}
	return TARGET_ACCEPT;
}